

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

unsigned_short insn_find(insn_map *insns,uint max,uint id,unsigned_short **cache)

{
  unsigned_short *puVar1;
  unsigned_short **cache_local;
  uint id_local;
  uint max_local;
  insn_map *insns_local;
  
  if (insns[max - 1].id < id) {
    insns_local._6_2_ = 0;
  }
  else {
    if (*cache == (unsigned_short *)0x0) {
      puVar1 = make_id2insn(insns,max);
      *cache = puVar1;
    }
    insns_local._6_2_ = (*cache)[id];
  }
  return insns_local._6_2_;
}

Assistant:

unsigned short insn_find(insn_map *insns, unsigned int max, unsigned int id, unsigned short **cache)
{
	if (id > insns[max - 1].id)
		return 0;

	if (*cache == NULL)
		*cache = make_id2insn(insns, max);

	return (*cache)[id];
}